

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O2

FT_Error cff_index_get_pointers(CFF_Index idx,FT_Byte ***table,FT_Byte **pool,FT_ULong *pool_size)

{
  byte bVar1;
  uint uVar2;
  FT_Memory memory;
  FT_Stream stream;
  FT_Memory memory_00;
  FT_Byte *pFVar3;
  FT_Byte **ppFVar4;
  FT_Byte *pFVar5;
  FT_ULong *pFVar6;
  ulong *puVar7;
  FT_Byte *pFVar8;
  ulong uVar9;
  FT_ULong FVar10;
  uint *puVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  FT_Error local_38;
  FT_Error local_34;
  FT_Error error_1;
  FT_Error error;
  
  local_34 = 0;
  memory = idx->stream->memory;
  *table = (FT_Byte **)0x0;
  if (idx->offsets != (FT_ULong *)0x0) goto LAB_001fcc80;
  local_38 = 0;
  if (idx->count == 0) {
LAB_001fce4a:
    local_34 = 0;
  }
  else {
    stream = idx->stream;
    memory_00 = stream->memory;
    bVar1 = idx->off_size;
    uVar13 = (ulong)(idx->count + 1);
    pFVar6 = (FT_ULong *)ft_mem_realloc(memory_00,8,0,uVar13,(void *)0x0,&local_38);
    idx->offsets = pFVar6;
    if ((local_38 == 0) &&
       (local_38 = FT_Stream_Seek(stream,(ulong)idx->hdr_size + idx->start), local_38 == 0)) {
      FVar10 = uVar13 * bVar1;
      local_38 = FT_Stream_EnterFrame(stream,FVar10);
      if (local_38 == 0) {
        puVar7 = idx->offsets;
        puVar11 = (uint *)stream->cursor;
        puVar12 = (uint *)(FVar10 + (long)puVar11);
        if (bVar1 == 1) {
          for (; puVar11 < puVar12; puVar11 = (uint *)((long)puVar11 + 1)) {
            *puVar7 = (ulong)(byte)*puVar11;
            puVar7 = puVar7 + 1;
          }
        }
        else if (bVar1 == 2) {
          for (; puVar11 < puVar12; puVar11 = (uint *)((long)puVar11 + 2)) {
            *puVar7 = (ulong)(ushort)((ushort)*puVar11 << 8 | (ushort)*puVar11 >> 8);
            puVar7 = puVar7 + 1;
          }
        }
        else if (bVar1 == 3) {
          for (; puVar11 < puVar12; puVar11 = (uint *)((long)puVar11 + 3)) {
            *puVar7 = (ulong)*(byte *)((long)puVar11 + 2) |
                      (ulong)((uint)*(byte *)((long)puVar11 + 1) << 8 | (uint)(byte)*puVar11 << 0x10
                             );
            puVar7 = puVar7 + 1;
          }
        }
        else {
          for (; puVar11 < puVar12; puVar11 = puVar11 + 1) {
            uVar2 = *puVar11;
            *puVar7 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18);
            puVar7 = puVar7 + 1;
          }
        }
        FT_Stream_ExitFrame(stream);
        if (local_38 == 0) goto LAB_001fce4a;
      }
    }
    ft_mem_free(memory_00,idx->offsets);
    idx->offsets = (FT_ULong *)0x0;
    local_34 = local_38;
    if (local_38 != 0) {
      return local_38;
    }
  }
LAB_001fcc80:
  uVar2 = idx->count;
  if ((ulong)uVar2 != 0) {
    FVar10 = (ulong)uVar2 + idx->data_size;
    ppFVar4 = (FT_Byte **)ft_mem_realloc(memory,8,0,(ulong)(uVar2 + 1),(void *)0x0,&local_34);
    if (local_34 == 0) {
      if (pool == (FT_Byte **)0x0) {
        pFVar5 = (FT_Byte *)0x0;
      }
      else {
        pFVar5 = (FT_Byte *)ft_mem_alloc(memory,FVar10,&local_34);
        if (local_34 != 0) {
          return local_34;
        }
      }
      pFVar3 = idx->bytes;
      pFVar8 = pFVar5;
      if (pool == (FT_Byte **)0x0) {
        pFVar8 = pFVar3;
      }
      *ppFVar4 = pFVar8;
      lVar15 = 0;
      uVar14 = 0;
      for (uVar13 = 1; uVar13 <= idx->count; uVar13 = uVar13 + 1) {
        uVar9 = idx->offsets[uVar13] - 1;
        uVar16 = uVar14;
        if ((uVar14 <= uVar9) && (uVar16 = idx->data_size, uVar9 < idx->data_size)) {
          uVar16 = uVar9;
        }
        if (pool == (FT_Byte **)0x0) {
          ppFVar4[uVar13] = pFVar3 + uVar16;
        }
        else {
          ppFVar4[uVar13] = pFVar5 + lVar15 + uVar16;
          if (uVar16 != uVar14) {
            memcpy(ppFVar4[uVar13 - 1],pFVar3 + uVar14,
                   (long)(pFVar5 + lVar15 + uVar16) - (long)ppFVar4[uVar13 - 1]);
            *ppFVar4[uVar13] = '\0';
            ppFVar4[uVar13] = ppFVar4[uVar13] + 1;
            lVar15 = lVar15 + 1;
          }
        }
        uVar14 = uVar16;
      }
      *table = ppFVar4;
      if (pool != (FT_Byte **)0x0) {
        *pool = pFVar5;
      }
      if (pool_size != (FT_ULong *)0x0) {
        *pool_size = FVar10;
      }
    }
  }
  return local_34;
}

Assistant:

static FT_Error
  cff_index_get_pointers( CFF_Index   idx,
                          FT_Byte***  table,
                          FT_Byte**   pool,
                          FT_ULong*   pool_size )
  {
    FT_Error   error     = FT_Err_Ok;
    FT_Memory  memory    = idx->stream->memory;

    FT_Byte**  t         = NULL;
    FT_Byte*   new_bytes = NULL;
    FT_ULong   new_size;


    *table = NULL;

    if ( !idx->offsets )
    {
      error = cff_index_load_offsets( idx );
      if ( error )
        goto Exit;
    }

    new_size = idx->data_size + idx->count;

    if ( idx->count > 0                                &&
         !FT_NEW_ARRAY( t, idx->count + 1 )            &&
         ( !pool || !FT_ALLOC( new_bytes, new_size ) ) )
    {
      FT_ULong  n, cur_offset;
      FT_ULong  extra = 0;
      FT_Byte*  org_bytes = idx->bytes;


      /* at this point, `idx->offsets' can't be NULL */
      cur_offset = idx->offsets[0] - 1;

      /* sanity check */
      if ( cur_offset != 0 )
      {
        FT_TRACE0(( "cff_index_get_pointers:"
                    " invalid first offset value %d set to zero\n",
                    cur_offset ));
        cur_offset = 0;
      }

      if ( !pool )
        t[0] = org_bytes + cur_offset;
      else
        t[0] = new_bytes + cur_offset;

      for ( n = 1; n <= idx->count; n++ )
      {
        FT_ULong  next_offset = idx->offsets[n] - 1;


        /* two sanity checks for invalid offset tables */
        if ( next_offset < cur_offset )
          next_offset = cur_offset;
        else if ( next_offset > idx->data_size )
          next_offset = idx->data_size;

        if ( !pool )
          t[n] = org_bytes + next_offset;
        else
        {
          t[n] = new_bytes + next_offset + extra;

          if ( next_offset != cur_offset )
          {
            FT_MEM_COPY( t[n - 1], org_bytes + cur_offset, t[n] - t[n - 1] );
            t[n][0] = '\0';
            t[n]   += 1;
            extra++;
          }
        }

        cur_offset = next_offset;
      }
      *table = t;

      if ( pool )
        *pool = new_bytes;
      if ( pool_size )
        *pool_size = new_size;
    }

  Exit:
    return error;
  }